

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O3

bool __thiscall
PressDelayHandler::released
          (PressDelayHandler *this,QEvent *e,bool scrollerWasActive,bool scrollerIsActive)

{
  Data *pDVar1;
  QMouseEvent *pQVar2;
  bool bVar3;
  QMouseEvent *oldD;
  
  bVar3 = scrollerWasActive || scrollerIsActive;
  if ((this->pressDelayTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  pDVar1 = (this->mouseTarget).wp.d;
  if ((this->pressDelayEvent).d == (QMouseEvent *)0x0) {
    if (pDVar1 == (Data *)0x0) goto LAB_00651867;
  }
  else {
    if (pDVar1 == (Data *)0x0) goto LAB_00651867;
    if ((*(int *)(pDVar1 + 4) != 0) &&
       ((this->mouseTarget).wp.value != (QObject *)0x0 && !scrollerIsActive)) {
      pQVar2 = copyMouseEvent(e);
      sendMouseEvent(this,(this->pressDelayEvent).d,1);
      sendMouseEvent(this,pQVar2,0);
      bVar3 = true;
      if (pQVar2 != (QMouseEvent *)0x0) {
        (**(code **)(*(long *)pQVar2 + 8))(pQVar2);
      }
      goto LAB_00651867;
    }
  }
  if ((*(int *)(pDVar1 + 4) != 0) &&
     (scrollerIsActive && (this->mouseTarget).wp.value != (QObject *)0x0)) {
    sendMouseEvent(this,(QMouseEvent *)0x0,1);
  }
LAB_00651867:
  pQVar2 = (this->pressDelayEvent).d;
  if (pQVar2 != (QMouseEvent *)0x0) {
    (this->pressDelayEvent).d = (QMouseEvent *)0x0;
    (**(code **)(*(long *)pQVar2 + 8))();
  }
  pDVar1 = (this->mouseTarget).wp.d;
  (this->mouseTarget).wp.d = (Data *)0x0;
  (this->mouseTarget).wp.value = (QObject *)0x0;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  return bVar3;
}

Assistant:

bool released(QEvent *e, bool scrollerWasActive, bool scrollerIsActive)
    {
        // consume this event if the scroller was or is active
        bool result = scrollerWasActive || scrollerIsActive;

        // stop the timer
        if (pressDelayTimer.isActive())
            pressDelayTimer.stop();

        // we still haven't even sent the press, so do it now
        if (pressDelayEvent && mouseTarget && !scrollerIsActive) {
            QScopedPointer<QMouseEvent> releaseEvent(copyMouseEvent(e));

            qFGDebug() << "QFG: re-sending mouse press (due to release) for " << mouseTarget;
            sendMouseEvent(pressDelayEvent.data(), UngrabMouseBefore);

            qFGDebug() << "QFG: faking mouse release (due to release) for " << mouseTarget;
            sendMouseEvent(releaseEvent.data());

            result = true; // consume this event
        } else if (mouseTarget && scrollerIsActive) {
            // we grabbed the mouse explicitly when the scroller became active, so undo that now
            sendMouseEvent(nullptr, UngrabMouseBefore);
        }
        pressDelayEvent.reset(nullptr);
        mouseTarget = nullptr;
        return result;
    }